

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space2.cpp
# Opt level: O1

int right_of_aliens_proc(Am_Object *param_1)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Object this_alien;
  Am_Value_List aliens;
  Am_Object local_40;
  Am_Object local_38;
  Am_Value_List local_30 [16];
  
  pAVar5 = (Am_Value *)Am_Object::Get(0x82f8,0x82);
  Am_Value_List::Am_Value_List(local_30,pAVar5);
  local_40.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Object((ushort)&local_38,0x1082f8);
  pAVar5 = (Am_Value *)Am_Object::Get((ushort)&local_38,0x66);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  Am_Object::~Am_Object(&local_38);
  Am_Value_List::End();
  do {
    cVar1 = Am_Value_List::First();
    if (cVar1 != '\0') {
LAB_00104a49:
      Am_Object::~Am_Object(&local_40);
      Am_Value_List::~Am_Value_List(local_30);
      return iVar2;
    }
    pAVar5 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&local_40,pAVar5);
    Am_Object::Get((ushort)&local_40,0xb0);
    cVar1 = Am_Value::Valid();
    if (cVar1 != '\0') {
      pAVar5 = (Am_Value *)Am_Object::Get((ushort)&local_40,100);
      iVar3 = Am_Value::operator_cast_to_int(pAVar5);
      pAVar5 = (Am_Value *)Am_Object::Get((ushort)&local_40,0x66);
      iVar4 = Am_Value::operator_cast_to_int(pAVar5);
      iVar2 = (iVar2 - (iVar3 + iVar4)) + -10;
      goto LAB_00104a49;
    }
    Am_Value_List::Prev();
  } while( true );
}

Assistant:

Am_Define_No_Self_Formula(int, right_of_aliens)
{
  Am_Value_List aliens = Aliens.Get(Am_GRAPHICAL_PARTS);
  Am_Object this_alien;
  int right = Aliens.Get_Owner().Get(Am_WIDTH);
  for (aliens.End(); !aliens.First(); aliens.Prev()) {
    this_alien = aliens.Get();
    if (this_alien.Get(Am_IMAGE).Valid()) {
      return right - (int)this_alien.Get(Am_LEFT) -
             (int)this_alien.Get(Am_WIDTH) - 10;
    }
  }
  return right;
}